

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<signed_char,signed_char>
          (Thread *this,BinopFunc<signed_char,_signed_char> *f)

{
  char cVar1;
  u8 i;
  long lVar2;
  Value VVar3;
  SR result;
  Simd<signed_char,_(unsigned_char)__x10_> lhs;
  anon_union_16_6_113bff37_for_Value_0 local_48;
  anon_union_16_6_113bff37_for_Value_0 local_38;
  
  VVar3 = Pop(this);
  local_38.v128_.v = (v128)Pop(this);
  lVar2 = 0;
  do {
    cVar1 = (*f)(*(char *)((long)&local_38 + lVar2),VVar3.field_0._0_1_);
    *(char *)((long)&local_48 + lVar2) = cVar1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  Push(this,(Value)local_48.v128_.v);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}